

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

void __thiscall
llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::clear
          (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  StringMapEntryBase *__ptr;
  ulong uVar3;
  
  if ((this->super_StringMapImpl).NumItems != 0) {
    uVar1 = (this->super_StringMapImpl).NumBuckets;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ppSVar2 = (this->super_StringMapImpl).TheTable;
      __ptr = ppSVar2[uVar3];
      if ((__ptr != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (__ptr != (StringMapEntryBase *)0x0)) {
        free(__ptr);
      }
      ppSVar2[uVar3] = (StringMapEntryBase *)0x0;
    }
    (this->super_StringMapImpl).NumItems = 0;
    (this->super_StringMapImpl).NumTombstones = 0;
  }
  return;
}

Assistant:

bool empty() const { return NumItems == 0; }